

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O3

void __thiscall CHud::RenderCursor(CHud *this)

{
  CGameClient *pCVar1;
  CCamera *pCVar2;
  IGraphics *pIVar3;
  CControls *pCVar4;
  
  pCVar1 = (this->super_CComponent).m_pClient;
  if (((pCVar1->m_Snap).m_pLocalCharacter != (CNetObj_Character *)0x0) &&
     (pCVar1->m_pClient->m_State != 4)) {
    pCVar2 = pCVar1->m_pCamera;
    CRenderTools::MapScreenToGroup
              (&pCVar1->m_RenderTools,(pCVar2->m_Center).field_0.x,(pCVar2->m_Center).field_1.y,
               (pCVar1->m_Layers).m_pGameGroup,pCVar2->m_Zoom);
    pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])
              (pIVar3,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])
              ();
    pCVar1 = (this->super_CComponent).m_pClient;
    CRenderTools::SelectSprite
              (&pCVar1->m_RenderTools,
               (g_pData->m_Weapons).m_aId[((pCVar1->m_Snap).m_pLocalCharacter)->m_Weapon % 6].
               m_pSpriteCursor,0,0,0);
    pCVar1 = (this->super_CComponent).m_pClient;
    pCVar4 = pCVar1->m_pControls;
    CRenderTools::DrawSprite
              (&pCVar1->m_RenderTools,(pCVar4->m_TargetPos).field_0.x,
               (pCVar4->m_TargetPos).field_1.y,64.0);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])
              ();
    return;
  }
  return;
}

Assistant:

void CHud::RenderCursor()
{
	if(!m_pClient->m_Snap.m_pLocalCharacter || Client()->State() == IClient::STATE_DEMOPLAYBACK)
		return;

	vec2 Pos = *m_pClient->m_pCamera->GetCenter();
	RenderTools()->MapScreenToGroup(Pos.x, Pos.y, Layers()->GameGroup(), m_pClient->m_pCamera->GetZoom());
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->QuadsBegin();

	// render cursor
	RenderTools()->SelectSprite(g_pData->m_Weapons.m_aId[m_pClient->m_Snap.m_pLocalCharacter->m_Weapon%NUM_WEAPONS].m_pSpriteCursor);
	float CursorSize = 64;
	RenderTools()->DrawSprite(m_pClient->m_pControls->m_TargetPos.x, m_pClient->m_pControls->m_TargetPos.y, CursorSize);
	Graphics()->QuadsEnd();
}